

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurlHandle.cpp
# Opt level: O0

size_t __thiscall
curlpp::internal::CurlHandle::executeHeaderFunctor
          (CurlHandle *this,char *buffer,size_t size,size_t nitems)

{
  bool bVar1;
  CallbackExceptionBase *e_00;
  CurlHandle *in_RDI;
  CallbackExceptionBase *e;
  LogicError *in_stack_ffffffffffffff78;
  CallbackException<curlpp::LogicError> *in_stack_ffffffffffffff80;
  Parm1 in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffffc8;
  LogicError *in_stack_ffffffffffffffd0;
  undefined8 local_8;
  
  bVar1 = utilspp::
          Functor<unsigned_long,_utilspp::tl::TypeList<char_*,_utilspp::tl::TypeList<unsigned_long,_utilspp::tl::TypeList<unsigned_long,_utilspp::NullType>_>_>_>
          ::operator!((Functor<unsigned_long,_utilspp::tl::TypeList<char_*,_utilspp::tl::TypeList<unsigned_long,_utilspp::tl::TypeList<unsigned_long,_utilspp::NullType>_>_>_>
                       *)0x14dea1);
  if (bVar1) {
    e_00 = (CallbackExceptionBase *)operator_new(0x20);
    LogicError::LogicError(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    CallbackException<curlpp::LogicError>::CallbackException
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    setException(in_RDI,e_00);
    LogicError::~LogicError((LogicError *)0x14df00);
    local_8 = 0x2a;
  }
  else {
    local_8 = utilspp::
              Functor<unsigned_long,_utilspp::tl::TypeList<char_*,_utilspp::tl::TypeList<unsigned_long,_utilspp::tl::TypeList<unsigned_long,_utilspp::NullType>_>_>_>
              ::operator()((Functor<unsigned_long,_utilspp::tl::TypeList<char_*,_utilspp::tl::TypeList<unsigned_long,_utilspp::tl::TypeList<unsigned_long,_utilspp::NullType>_>_>_>
                            *)in_RDI,in_stack_ffffffffffffff88,(Parm2)in_stack_ffffffffffffff80,
                           (Parm3)in_stack_ffffffffffffff78);
  }
  return local_8;
}

Assistant:

size_t 
CurlHandle::executeHeaderFunctor(char * buffer, size_t size, size_t nitems)
{
	if (!mHeaderFunctor)
	{
		setException(new CallbackException<curlpp::LogicError>(curlpp::LogicError("Null write functor")));
		return CURLE_ABORTED_BY_CALLBACK;
	}

	try
	{
		return mHeaderFunctor(buffer, size, nitems);
	}

	catch(curlpp::CallbackExceptionBase * e)
	{
		setException(e);
	}

	catch(...)
	{
		setException(new CallbackException<curlpp::UnknowException>(curlpp::UnknowException()));
	}

	return CURLE_ABORTED_BY_CALLBACK;
}